

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O0

int smem_write(int driverhandle,void *buffer,long nbytes)

{
  int iVar1;
  SHARED_P pvVar2;
  long nbytes_local;
  void *buffer_local;
  int driverhandle_local;
  
  if (buffer == (void *)0x0) {
    buffer_local._4_4_ = 0x98;
  }
  else {
    iVar1 = shared_check_locked_index(driverhandle);
    if (iVar1 == 0) {
      if (shared_lt[driverhandle].lkcnt == -1) {
        if (nbytes < 0) {
          buffer_local._4_4_ = 0x97;
        }
        else if (((long)shared_gt[driverhandle].size - 0x10U <
                  (ulong)(shared_lt[driverhandle].seekpos + nbytes)) &&
                (pvVar2 = shared_realloc(driverhandle,
                                         shared_lt[driverhandle].seekpos + nbytes + 0x10),
                pvVar2 == (SHARED_P)0x0)) {
          buffer_local._4_4_ = 0x9c;
        }
        else {
          memcpy((void *)((long)shared_lt[driverhandle].p + shared_lt[driverhandle].seekpos + 0x18),
                 buffer,nbytes);
          shared_lt[driverhandle].seekpos = nbytes + shared_lt[driverhandle].seekpos;
          buffer_local._4_4_ = 0;
        }
      }
      else {
        buffer_local._4_4_ = -1;
      }
    }
    else {
      buffer_local._4_4_ = -1;
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int     smem_write(int driverhandle, void *buffer, long nbytes)
 {
   if (NULL == buffer) return(SHARED_NULPTR);
   if (shared_check_locked_index(driverhandle)) return(SHARED_INVALID);
   if (-1 != shared_lt[driverhandle].lkcnt) return(SHARED_INVALID); /* are we locked RW ? */

   if (nbytes < 0) return(SHARED_BADARG);
   if ((unsigned long)(shared_lt[driverhandle].seekpos + nbytes) > (unsigned long)(shared_gt[driverhandle].size - sizeof(DAL_SHM_SEGHEAD)))
     {                  /* need to realloc shmem */
       if (NULL == shared_realloc(driverhandle, shared_lt[driverhandle].seekpos + nbytes + sizeof(DAL_SHM_SEGHEAD)))
         return(SHARED_NOMEM);
     }

   memcpy(((char *)(((DAL_SHM_SEGHEAD *)(shared_lt[driverhandle].p + 1)) + 1)) +
                shared_lt[driverhandle].seekpos,
          buffer,
          nbytes);

   shared_lt[driverhandle].seekpos += nbytes;
   return(0);
 }